

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteSpherical::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteSpherical *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChBodyFrame *pCVar15;
  ChBodyFrame *pCVar16;
  double dVar17;
  double dVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  double local_38;
  double local_30;
  double local_28;
  
  pCVar15 = (this->super_ChLink).Body1;
  pCVar16 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->m_pos1,&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar15 = (this->super_ChLink).Body1;
  dVar23 = local_30 -
           (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar17 = local_38 -
           (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar18 = local_28 -
           (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(double *)
                  ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar17;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar1 = vfmadd231sd_fma(auVar49,auVar25,auVar1);
  auVar38._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar38._8_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar43._8_8_ = dVar17;
  auVar43._0_8_ = dVar17;
  auVar48._8_8_ = dVar18;
  auVar48._0_8_ = dVar18;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar18;
  auVar25 = vfmadd231sd_fma(auVar1,auVar35,auVar2);
  auVar1 = vfmadd132pd_fma(auVar43,auVar38,
                           *(undefined1 (*) [16])
                            (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar2 = vfmadd132pd_fma(auVar48,auVar1,
                           *(undefined1 (*) [16])
                            ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data + 0x30));
  dVar23 = (this->m_pos2).m_data[0] - auVar2._0_8_;
  auVar1 = vshufpd_avx(auVar2,auVar2,1);
  dVar17 = (this->m_pos2).m_data[1] - auVar1._0_8_;
  dVar18 = (this->m_pos2).m_data[2] - auVar25._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar17 * dVar17;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar23;
  auVar1 = vfmadd231sd_fma(auVar26,auVar31,auVar31);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar18;
  auVar1 = vfmadd231sd_fma(auVar1,auVar39,auVar39);
  auVar1 = vsqrtsd_avx(auVar1,auVar1);
  bVar19 = 2.2250738585072014e-308 <= auVar1._0_8_;
  pCVar16 = (this->super_ChLink).Body2;
  dVar41 = 1.0 / auVar1._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (this->m_dir1).m_data[2];
  auVar20._0_8_ =
       (double)((ulong)bVar19 * (long)(dVar23 * dVar41) + (ulong)!bVar19 * 0x3ff0000000000000);
  auVar20._8_8_ = 0;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (this->m_dir1).m_data[0];
  dVar17 = (double)((ulong)bVar19 * (long)(dVar17 * dVar41));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar17;
  dVar23 = (this->m_dir1).m_data[1];
  dVar18 = (double)((ulong)bVar19 * (long)(dVar18 * dVar41));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar18;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar1 = vfmadd231sd_fma(auVar46,auVar32,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 8);
  auVar3 = vfmadd231sd_fma(auVar40,auVar32,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x38);
  auVar4 = vfmadd231sd_fma(auVar36,auVar32,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar1 = vfmadd231sd_fma(auVar1,auVar44,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar3 = vfmadd231sd_fma(auVar3,auVar44,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar4 = vfmadd231sd_fma(auVar4,auVar44,auVar8);
  dVar23 = auVar1._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar1 = vfmadd231sd_fma(auVar51,auVar3,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar5 = vfmadd231sd_fma(auVar33,auVar3,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       dVar23 * *(double *)
                 ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar3 = vfmadd231sd_fma(auVar53,auVar3,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar1 = vfmadd231sd_fma(auVar1,auVar4,auVar12);
  dVar50 = auVar1._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar5 = vfmadd231sd_fma(auVar5,auVar4,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar14);
  dVar52 = auVar3._0_8_;
  dVar41 = auVar5._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar18 * dVar50;
  auVar4 = vfmsub231sd_fma(auVar37,auVar5,auVar20);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar17 * dVar41;
  auVar3 = vfmsub231sd_fma(auVar47,auVar3,auVar22);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar52 * auVar20._0_8_;
  auVar1 = vfmsub231sd_fma(auVar55,auVar1,auVar21);
  dVar34 = auVar4._0_8_;
  dVar23 = dVar41 + auVar20._0_8_ + dVar34;
  dVar45 = auVar3._0_8_;
  dVar54 = auVar1._0_8_;
  if (0.0 <= dVar23) {
    dVar23 = dVar23 + 1.0;
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar23;
      auVar1 = vsqrtsd_avx(auVar28,auVar28);
      dVar23 = auVar1._0_8_;
    }
    dVar42 = dVar23 * 0.5;
    dVar23 = 0.5 / dVar23;
    dVar41 = (dVar54 - dVar52) * dVar23;
    dVar34 = (dVar50 - dVar18) * dVar23;
    dVar23 = (dVar17 - dVar45) * dVar23;
    goto LAB_005ae031;
  }
  if (dVar34 <= auVar20._0_8_) {
    if (auVar20._0_8_ < dVar41) goto LAB_005adda0;
    dVar23 = ((auVar20._0_8_ - dVar34) - dVar41) + 1.0;
    if (dVar23 < 0.0) {
      dVar24 = sqrt(dVar23);
    }
    else {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar23;
      auVar1 = vsqrtsd_avx(auVar30,auVar30);
      dVar24 = auVar1._0_8_;
    }
    dVar42 = dVar54 - dVar52;
    dVar41 = dVar24 * 0.5;
    dVar24 = 0.5 / dVar24;
    dVar34 = (dVar17 + dVar45) * dVar24;
    dVar23 = (dVar18 + dVar50) * dVar24;
  }
  else if (dVar34 < dVar41) {
LAB_005adda0:
    dVar23 = ((dVar41 - auVar20._0_8_) - dVar34) + 1.0;
    if (dVar23 < 0.0) {
      dVar24 = sqrt(dVar23);
    }
    else {
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar23;
      auVar1 = vsqrtsd_avx(auVar29,auVar29);
      dVar24 = auVar1._0_8_;
    }
    dVar42 = dVar17 - dVar45;
    dVar23 = dVar24 * 0.5;
    dVar24 = 0.5 / dVar24;
    dVar41 = (dVar18 + dVar50) * dVar24;
    dVar34 = (dVar52 + dVar54) * dVar24;
  }
  else {
    dVar23 = ((dVar34 - dVar41) - auVar20._0_8_) + 1.0;
    if (dVar23 < 0.0) {
      dVar24 = sqrt(dVar23);
    }
    else {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar23;
      auVar1 = vsqrtsd_avx(auVar27,auVar27);
      dVar24 = auVar1._0_8_;
    }
    dVar42 = dVar50 - dVar18;
    dVar34 = dVar24 * 0.5;
    dVar24 = 0.5 / dVar24;
    dVar23 = (dVar52 + dVar54) * dVar24;
    dVar41 = (dVar17 + dVar45) * dVar24;
  }
  dVar42 = dVar42 * dVar24;
LAB_005ae031:
  *(undefined1 (*) [16])(__return_storage_ptr__->pos).m_data = auVar2;
  (__return_storage_ptr__->pos).m_data[2] = auVar25._0_8_;
  (__return_storage_ptr__->rot).m_data[0] = dVar42;
  (__return_storage_ptr__->rot).m_data[1] = dVar41;
  (__return_storage_ptr__->rot).m_data[2] = dVar34;
  (__return_storage_ptr__->rot).m_data[3] = dVar23;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteSpherical::GetLinkRelativeCoords() {
    ChVector<> pos1 = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_pos1));

    ChVector<> u = (m_pos2 - pos1).GetNormalized();
    ChVector<> w = Body2->TransformDirectionParentToLocal(Body1->TransformDirectionLocalToParent(m_dir1));
    ChVector<> v = Vcross(w, u);
    ChMatrix33<> A(u, v, w);

    return ChCoordsys<>(pos1, A.Get_A_quaternion());
}